

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  CacheEntryType type_1;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  CacheEntryType local_34;
  
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar5 != 0)) {
    ParseCacheEntry::reg.regmatch.startp[0] = (char *)0x0;
    ParseCacheEntry::reg.regmatch.endp[0] = (char *)0x0;
    ParseCacheEntry::reg.regmatch.searchstring = (char *)0x0;
    ParseCacheEntry::reg.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar5 != 0)) {
    ParseCacheEntry::regQuoted.regmatch.startp[0] = (char *)0x0;
    ParseCacheEntry::regQuoted.regmatch.endp[0] = (char *)0x0;
    ParseCacheEntry::regQuoted.regmatch.searchstring = (char *)0x0;
    ParseCacheEntry::regQuoted.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  bVar4 = cmsys::RegularExpression::find
                    (&ParseCacheEntry::regQuoted,(entry->_M_dataplus)._M_p,
                     &ParseCacheEntry::regQuoted.regmatch);
  if (bVar4) {
    if (ParseCacheEntry::regQuoted.regmatch.startp[1] == (char *)0x0) {
      local_58 = &local_48;
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,ParseCacheEntry::regQuoted.regmatch.startp[1],
                 ParseCacheEntry::regQuoted.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    local_58 = &local_48;
    if (ParseCacheEntry::regQuoted.regmatch.startp[2] == (char *)0x0) {
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,ParseCacheEntry::regQuoted.regmatch.startp[2],
                 ParseCacheEntry::regQuoted.regmatch.endp[2]);
    }
    pcVar3 = local_58;
    local_34 = STRING;
    StringToCacheEntryType(local_58,&local_34);
    *type = local_34;
    pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
    pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    if (pcVar3 != &local_48) {
      operator_delete(pcVar3,CONCAT71(uStack_47,local_48) + 1);
      pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    }
joined_r0x001b4364:
    if (pcVar1 == (char *)0x0) {
      local_58 = &local_48;
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar1,pcVar2);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if (local_58 == &local_48) goto LAB_001b43af;
  }
  else {
    bVar4 = cmsys::RegularExpression::find
                      (&ParseCacheEntry::reg,(entry->_M_dataplus)._M_p,
                       &ParseCacheEntry::reg.regmatch);
    if (bVar4) {
      if (ParseCacheEntry::reg.regmatch.startp[1] == (char *)0x0) {
        local_58 = &local_48;
        local_50 = 0;
        local_48 = '\0';
      }
      else {
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,ParseCacheEntry::reg.regmatch.startp[1],
                   ParseCacheEntry::reg.regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      local_58 = &local_48;
      if (ParseCacheEntry::reg.regmatch.startp[2] == (char *)0x0) {
        local_50 = 0;
        local_48 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,ParseCacheEntry::reg.regmatch.startp[2],
                   ParseCacheEntry::reg.regmatch.endp[2]);
      }
      pcVar3 = local_58;
      local_34 = STRING;
      StringToCacheEntryType(local_58,&local_34);
      *type = local_34;
      pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      if (pcVar3 != &local_48) {
        operator_delete(pcVar3,CONCAT71(uStack_47,local_48) + 1);
        pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
        pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      }
      goto joined_r0x001b4364;
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::reg == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::reg), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._0_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._80_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._160_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._192_8_ = 0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg);
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::regQuoted == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::regQuoted), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._0_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._80_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._160_8_ = 0;
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._192_8_ = 0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::regQuoted);
    }
    bVar4 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted,(entry->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted);
    if (bVar4) {
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._8_8_ == 0) {
        local_58 = &local_48;
        local_50 = 0;
        local_48 = '\0';
      }
      else {
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      uVar6 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._16_8_ != 0) goto LAB_001b44bc;
LAB_001b44c9:
      local_58 = &local_48;
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg,(entry->_M_dataplus)._M_p,
                         (RegularExpressionMatch *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
      if (!bVar4) {
        return false;
      }
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._8_8_ == 0) {
        local_58 = &local_48;
        local_50 = 0;
        local_48 = '\0';
      }
      else {
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      uVar6 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._16_8_ == 0) goto LAB_001b44c9;
LAB_001b44bc:
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,uVar7,uVar6);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if (local_58 == &local_48) goto LAB_001b43af;
  }
  operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
LAB_001b43af:
  if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  return true;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}